

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::LoadNewTargetObject(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  RegSlot RVar4;
  Symbol *this_00;
  undefined4 *puVar5;
  Symbol *newTargetSym;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  this_00 = FuncInfo::GetNewTargetSymbol(funcInfo);
  if (this_00 == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x8af,"(newTargetSym)","newTargetSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BVar3 = FuncInfo::IsClassConstructor(funcInfo);
  if (BVar3 == 0) {
    bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
    if (bVar2) {
      RVar4 = Symbol::GetLocation(this_00);
      Js::ByteCodeWriter::Reg1(&this->m_writer,LdUndef,RVar4);
    }
    else {
      RVar4 = Symbol::GetLocation(this_00);
      Js::ByteCodeWriter::Reg1(&this->m_writer,LdNewTarget,RVar4);
    }
  }
  else {
    BVar3 = FuncInfo::IsLambda(funcInfo);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x8b3,"(!funcInfo->IsLambda())","!funcInfo->IsLambda()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    RVar4 = Symbol::GetLocation(this_00);
    Js::ByteCodeWriter::ArgIn0(&this->m_writer,RVar4);
  }
  return;
}

Assistant:

void ByteCodeGenerator::LoadNewTargetObject(FuncInfo *funcInfo)
{
    Symbol* newTargetSym = funcInfo->GetNewTargetSymbol();
    Assert(newTargetSym);

    if (funcInfo->IsClassConstructor())
    {
        Assert(!funcInfo->IsLambda());

        m_writer.ArgIn0(newTargetSym->GetLocation());
    }
    else if (funcInfo->IsGlobalFunction())
    {
        m_writer.Reg1(Js::OpCode::LdUndef, newTargetSym->GetLocation());
    }
    else
    {
        m_writer.Reg1(Js::OpCode::LdNewTarget, newTargetSym->GetLocation());
    }
}